

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

int __thiscall
kratos::AssignStmt::clone
          (AssignStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *peVar1;
  undefined1 local_50 [8];
  shared_ptr<kratos::AssignStmt> stmt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  shared_ptr<kratos::Var> local_30;
  
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)(__fn + 0xc0) + 0x68))
  ;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)(__fn + 200) + 0x68));
  std::
  make_shared<kratos::AssignStmt,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>,kratos::AssignmentType_const&>
            ((shared_ptr<kratos::Var> *)local_50,&local_30,
             (AssignmentType *)
             &stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::AssignStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)local_50);
  Stmt::copy_meta((Stmt *)__fn,(shared_ptr<kratos::Stmt> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)local_50;
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar1;
  local_50 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> AssignStmt::clone() const {
    auto stmt = std::make_shared<AssignStmt>(left_->shared_from_this(), right_->shared_from_this(),
                                             assign_type_);
    copy_meta(stmt);
    return stmt;
}